

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_table.c
# Opt level: O2

char * getElementValue(IXML_Node *node)

{
  unsigned_short uVar1;
  IXML_Node *nodeptr;
  char *pcVar2;
  
  nodeptr = ixmlNode_getFirstChild(node);
  if (nodeptr != (IXML_Node *)0x0) {
    uVar1 = ixmlNode_getNodeType(nodeptr);
    if (uVar1 == 3) {
      pcVar2 = ixmlNode_getNodeValue(nodeptr);
      pcVar2 = ixmlCloneDOMString(pcVar2);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

DOMString getElementValue(IXML_Node *node)
{
	IXML_Node *child = (IXML_Node *)ixmlNode_getFirstChild(node);
	const DOMString temp = NULL;

	if (child && ixmlNode_getNodeType(child) == eTEXT_NODE) {
		temp = ixmlNode_getNodeValue(child);

		return ixmlCloneDOMString(temp);
	} else {
		return NULL;
	}
}